

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::Load<wabt::interp::Simd<unsigned_int,(unsigned_char)2>>
          (Thread *this,Instr instr,Simd<unsigned_int,_(unsigned_char)__x02_> *out,Ptr *out_trap)

{
  Store *store;
  Result RVar1;
  u64 offset;
  RunResult RVar2;
  Ptr memory;
  Ptr local_68;
  string local_50;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&memory,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  offset = PopPtr(this,&memory);
  RVar1 = Memory::Load<wabt::interp::Simd<unsigned_int,(unsigned_char)2>>
                    (memory.obj_,offset,(ulong)instr.field_2.imm_u32x2.snd,out);
  RVar2 = Ok;
  if (RVar1.enum_ == Error) {
    store = this->store_;
    StringPrintf_abi_cxx11_
              (&local_50,"out of bounds memory access: access at %lu+%zd >= max value %lu",
               offset + instr.field_2.imm_u32x2.snd,8,
               (long)((memory.obj_)->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)((memory.obj_)->data_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    Trap::New(&local_68,store,&local_50,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar2 = Trap;
  }
  RefPtr<wabt::interp::Memory>::reset(&memory);
  return RVar2;
}

Assistant:

RunResult Thread::Load(Instr instr, T* out, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  u64 offset = PopPtr(memory);
  TRAP_IF(Failed(memory->Load(offset, instr.imm_u32x2.snd, out)),
          StringPrintf("out of bounds memory access: access at %" PRIu64
                       "+%" PRIzd " >= max value %" PRIu64,
                       offset + instr.imm_u32x2.snd, sizeof(T),
                       memory->ByteSize()));
  return RunResult::Ok;
}